

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O1

bool is_dataset_locked(unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
                       *tasks,string_view dataset_id)

{
  bool bVar1;
  __node_base *p_Var2;
  char *pcVar3;
  uchar *local_80;
  undefined8 local_78;
  uchar local_70;
  undefined7 uStack_6f;
  undefined8 uStack_68;
  char *local_60;
  _Variadic_union<DatasetLock,_IteratorLock> local_58;
  undefined1 local_38;
  
  local_60 = dataset_id._M_str;
  p_Var2 = &(tasks->_M_h)._M_before_begin;
  pcVar3 = local_60 + dataset_id._M_len;
  do {
    p_Var2 = p_Var2->_M_nxt;
    if (p_Var2 == (__node_base *)0x0) break;
    local_80 = &local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,local_60,pcVar3);
    if (local_80 == &local_70) {
      local_58._24_8_ = uStack_68;
      local_58._0_8_ = local_58._M_first._M_storage._M_storage + 0x10;
    }
    else {
      local_58._0_8_ = local_80;
    }
    local_58._17_7_ = uStack_6f;
    local_58._M_first._M_storage._M_storage[0x10] = local_70;
    local_58._8_8_ = local_78;
    local_78 = 0;
    local_70 = '\0';
    local_38 = 0;
    local_80 = &local_70;
    bVar1 = TaskSpec::has_lock((TaskSpec *)(p_Var2 + 2),(DatabaseLock *)&local_58._M_first);
    std::__detail::__variant::_Variant_storage<false,_DatasetLock,_IteratorLock>::~_Variant_storage
              ((_Variant_storage<false,_DatasetLock,_IteratorLock> *)&local_58._M_first);
    if (local_80 != &local_70) {
      operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
    }
  } while (!bVar1);
  return p_Var2 != (__node_base *)0x0;
}

Assistant:

bool is_dataset_locked(const std::unordered_map<uint64_t, TaskSpec> &tasks,
                       std::string_view dataset_id) {
    for (const auto &[k, task] : tasks) {
        if (task.has_lock(DatasetLock(dataset_id))) {
            return true;
        }
    }
    return false;
}